

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O2

int ffgunt(fitsfile *fptr,char *keyname,char *unit,int *status)

{
  char *pcVar1;
  char comm [73];
  char valstring [71];
  
  if (0 < *status) {
    return *status;
  }
  ffgkey(fptr,keyname,valstring,comm,status);
  if (comm[0] == '[') {
    pcVar1 = strchr(comm,0x5d);
    if (pcVar1 != (char *)0x0) {
      *pcVar1 = '\0';
    }
    strcpy(unit,comm + 1);
  }
  else {
    *unit = '\0';
  }
  return *status;
}

Assistant:

int ffgunt( fitsfile *fptr,     /* I - FITS file pointer         */
            const char *keyname,      /* I - name of keyword to read   */
            char *unit,         /* O - keyword units             */
            int  *status)       /* IO - error status             */
/*
    Read (get) the units string from the comment field of the existing
    keyword. This routine uses a local FITS convention (not defined in the
    official FITS standard) in which the units are enclosed in 
    square brackets following the '/' comment field delimiter, e.g.:

    KEYWORD =                   12 / [kpc] comment string goes here
*/
{
    char valstring[FLEN_VALUE];
    char comm[FLEN_COMMENT];
    char *loc;

    if (*status > 0)
        return(*status);

    ffgkey(fptr, keyname, valstring, comm, status);  /* read the keyword */

    if (comm[0] == '[')
    {
        loc = strchr(comm, ']');   /*  find the closing bracket */
        if (loc)
            *loc = '\0';           /*  terminate the string */

        strcpy(unit, &comm[1]);    /*  copy the string */
     }
     else
        unit[0] = '\0';
 
    return(*status);
}